

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O2

bool __thiscall
Ptex::v2_2::PtexSeparableKernel::adjustMainToSubface(PtexSeparableKernel *this,int eid)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  
  if ((this->res).ulog2 == '\0') {
    upresU(this);
  }
  if ((this->res).vlog2 == '\0') {
    upresV(this);
  }
  bVar2 = (this->res).ulog2;
  if ('\0' < (char)bVar2) {
    bVar2 = bVar2 - 1;
    (this->res).ulog2 = bVar2;
  }
  bVar1 = (this->res).vlog2;
  if ('\0' < (char)bVar1) {
    bVar1 = bVar1 - 1;
    (this->res).vlog2 = bVar1;
  }
  iVar4 = 1 << (bVar2 & 0x1f);
  iVar3 = 1 << (bVar1 & 0x1f);
  switch(eid & 3) {
  case 0:
    this->v = this->v - iVar3;
    if (this->u < iVar4) {
      return true;
    }
    this->u = this->u - iVar4;
    break;
  case 1:
    if (this->v < iVar3) {
      return true;
    }
    this->v = this->v - iVar3;
    break;
  case 2:
    if (iVar4 <= this->u) {
      this->u = this->u - iVar4;
      return true;
    }
    break;
  case 3:
    this->u = this->u - iVar4;
    if (iVar3 <= this->v) {
      this->v = this->v - iVar3;
      return true;
    }
  }
  return false;
}

Assistant:

bool adjustMainToSubface(int eid)
    {
        // to adjust the kernel for the subface, we must adjust the res down and offset the uv coords
        // however, if the res is already zero, we must upres the kernel first
        if (res.ulog2 == 0) upresU();
        if (res.vlog2 == 0) upresV();

        if (res.ulog2 > 0) res.ulog2--;
        if (res.vlog2 > 0) res.vlog2--;

        // offset uv coords and determine whether target subface is the primary one
        bool primary = 0;
        int resu = res.u(), resv = res.v();
        switch (eid&3) {
        case e_bottom:
            primary = (u < resu);
            v -= resv;
            if (!primary) u -= resu;
            break;
        case e_right:
            primary = (v < resv);
            if (!primary) v -= resv;
            break;
        case e_top:
            primary = (u >= resu);
            if (primary) u -= resu;
            break;
        case e_left:
            primary = (v >= resv);
            u -= resu;
            if (primary) v -= resv;
            break;
        }
        return primary;
    }